

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::details::output_device::~output_device(output_device *this)

{
  basic_device::~basic_device(&this->super_basic_device);
  operator_delete(this);
  return;
}

Assistant:

virtual bool do_write(cppcms::impl::cgi::connection &c,booster::aio::const_buffer const &out,bool eof,booster::system::error_code &e) 
		{
			return c.write(out,eof,e);
		}